

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisIrregular.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::GridAxisIrregular::calculatePadding(GridAxisIrregular *this)

{
  pointer puVar1;
  iterator __position;
  ulong in_RAX;
  ushort uVar2;
  KUINT16 Padding;
  undefined8 uStack_28;
  
  puVar1 = (this->m_vui16Padding).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_vui16Padding).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar1) {
    (this->m_vui16Padding).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  uStack_28 = in_RAX & 0xffffffffffff;
  uVar2 = (this->super_GridAxisRegular).m_ui16NumPoints & 3;
  if (uVar2 != 0) {
    do {
      __position._M_current =
           (this->m_vui16Padding).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_vui16Padding).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short,std::allocator<unsigned_short>>::
        _M_realloc_insert<unsigned_short_const&>
                  ((vector<unsigned_short,std::allocator<unsigned_short>> *)&this->m_vui16Padding,
                   __position,(unsigned_short *)((long)&uStack_28 + 6));
      }
      else {
        *__position._M_current = uStack_28._6_2_;
        (this->m_vui16Padding).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return;
}

Assistant:

void GridAxisIrregular::calculatePadding()
{
    // Calculate padding needed to be on a 64 bit boundary.
    m_vui16Padding.clear();
    KUINT8 NumPadding = m_ui16NumPoints % 4;

    // Add the padding
    KUINT16 Padding = 0;
    for( KUINT8 i = 0; i < NumPadding; ++i )
    {
        m_vui16Padding.push_back( Padding );
    }
}